

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcknowledgePdu.cpp
# Opt level: O0

bool __thiscall DIS::AcknowledgePdu::operator==(AcknowledgePdu *this,AcknowledgePdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  AcknowledgePdu *rhs_local;
  AcknowledgePdu *this_local;
  
  local_19 = SimulationManagementFamilyPdu::operator==
                       (&this->super_SimulationManagementFamilyPdu,
                        &rhs->super_SimulationManagementFamilyPdu);
  bVar1 = EntityID::operator==(&this->_originatingID,&rhs->_originatingID);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = EntityID::operator==(&this->_receivingID,&rhs->_receivingID);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_acknowledgeFlag != rhs->_acknowledgeFlag) {
    local_19 = false;
  }
  if (this->_responseFlag != rhs->_responseFlag) {
    local_19 = false;
  }
  if (this->_requestID != rhs->_requestID) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool AcknowledgePdu::operator ==(const AcknowledgePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_originatingID == rhs._originatingID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;
     if( ! (_acknowledgeFlag == rhs._acknowledgeFlag) ) ivarsEqual = false;
     if( ! (_responseFlag == rhs._responseFlag) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }